

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractStringValidator.cpp
# Opt level: O3

XSerializable * xercesc_4_0::AbstractStringValidator::createObject(MemoryManager *param_1)

{
  return (XSerializable *)0x0;
}

Assistant:

void AbstractStringValidator::serialize(XSerializeEngine& serEng)
{

    DatatypeValidator::serialize(serEng);

    if (serEng.isStoring())
    {
        serEng.writeSize (fLength);
        serEng.writeSize (fMaxLength);
        serEng.writeSize (fMinLength);
        serEng<<fEnumerationInherited;

        /***
         *
         * Serialize RefArrayVectorOf<XMLCh>
         *
         ***/
        XTemplateSerializer::storeObject(fEnumeration, serEng);

    }
    else
    {
        serEng.readSize (fLength);
        serEng.readSize (fMaxLength);
        serEng.readSize (fMinLength);
        serEng>>fEnumerationInherited;

        /***
         *
         *  Deserialize RefArrayVectorOf<XMLCh>
         *
        ***/
        XTemplateSerializer::loadObject(&fEnumeration, 8, true, serEng);

    }

}